

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::setCapacity
          (Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this,size_t newSize)

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar2;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar3;
  __off_t in_RDX;
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> local_38;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 4)) {
    ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x10,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pMVar2 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pMVar1 = (this->builder).ptr; pMVar1 != pMVar2; pMVar1 = pMVar1 + 1) {
    ((local_38.pos)->ptr).disposer = (pMVar1->ptr).disposer;
    ((local_38.pos)->ptr).ptr = (pMVar1->ptr).ptr;
    (pMVar1->ptr).ptr = (ClientHook *)0x0;
    local_38.pos = local_38.pos + 1;
  }
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::operator=(&this->builder,&local_38);
  pMVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pMVar1 = local_38.ptr;
  if (local_38.ptr != (Maybe<kj::Own<capnp::ClientHook>_> *)0x0) {
    local_38.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    local_38.pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
    local_38.endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pMVar1,0x10,(long)pRVar3 - (long)pMVar1 >> 4,
               (long)pMVar2 - (long)pMVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }